

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O3

int phr_parse_headers(char *buf_start,size_t len,phr_header *headers,size_t *num_headers,
                     size_t last_len)

{
  size_t max_headers;
  int iVar1;
  undefined8 in_RAX;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int r;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  pcVar2 = buf_start + len;
  max_headers = *num_headers;
  *num_headers = 0;
  if (last_len != 0) {
    pcVar4 = buf_start + (last_len - 3);
    if (last_len < 3) {
      pcVar4 = buf_start;
    }
    iVar3 = 0;
    do {
      if (pcVar4 == pcVar2) {
        return -2;
      }
      pcVar5 = pcVar4 + 1;
      if (*pcVar4 == '\n') {
LAB_001082ed:
        iVar1 = iVar3 + 1;
      }
      else {
        iVar1 = 0;
        if (*pcVar4 == '\r') {
          if (pcVar5 == pcVar2) {
            return -2;
          }
          if (*pcVar5 != '\n') {
            return -1;
          }
          pcVar5 = pcVar4 + 2;
          goto LAB_001082ed;
        }
      }
      iVar3 = iVar1;
      pcVar4 = pcVar5;
    } while (iVar3 != 2);
  }
  pcVar2 = parse_headers(buf_start,pcVar2,headers,num_headers,max_headers,&local_14);
  if (pcVar2 != (char *)0x0) {
    local_14 = (int)pcVar2 - (int)buf_start;
  }
  return local_14;
}

Assistant:

int phr_parse_headers(const char *buf_start, size_t len, struct phr_header *headers, size_t *num_headers, size_t last_len)
{
    const char *buf = buf_start, *buf_end = buf + len;
    size_t max_headers = *num_headers;
    int r;

    *num_headers = 0;

    /* if last_len != 0, check if the response is complete (a fast countermeasure
       against slowloris */
    if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
        return r;
    }

    if ((buf = parse_headers(buf, buf_end, headers, num_headers, max_headers, &r)) == NULL) {
        return r;
    }

    return (int)(buf - buf_start);
}